

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLock::ConstraintsFetch_react(ChLinkLock *this,double factor)

{
  ChVector<double> *pCVar1;
  ChVector<double> *pCVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  pointer ppCVar21;
  ChConstraintTwoBodies *pCVar22;
  ChMarker *pCVar23;
  ChMarker *pCVar24;
  ChBodyFrame *pCVar25;
  ChLinkLimit *pCVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  long lVar31;
  uint uVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ChMatrix34<> Ts;
  ChMatrix44<> qs_tilde;
  ChMatrix44<> Chi__q1p_barT;
  assign_op<double,_double> local_289;
  double local_288;
  Matrix<double,_3,_4,_1,_3,_4> local_280;
  Product<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>
  local_220;
  undefined1 local_1e0 [48];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [24];
  undefined1 local_168 [16];
  double local_158;
  undefined8 local_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_130;
  undefined8 local_128;
  double local_120;
  undefined8 local_118;
  double local_110;
  double local_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  double local_d0;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  ulong local_b0;
  ulong uStack_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  
  dVar3 = DAT_00b689a0;
  pCVar1 = &(this->super_ChLinkMarkers).super_ChLink.react_force;
  if (pCVar1 != (ChVector<double> *)&VNULL) {
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[0] = VNULL;
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = dVar3;
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = DAT_00b689a8;
  }
  dVar3 = DAT_00b689a0;
  pCVar2 = &(this->super_ChLinkMarkers).super_ChLink.react_torque;
  if (pCVar2 != (ChVector<double> *)&VNULL) {
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] = VNULL;
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = dVar3;
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = DAT_00b689a8;
  }
  lVar31 = (long)(this->mask).super_ChLinkMask.nconstr;
  if (0 < lVar31) {
    ppCVar21 = (this->mask).super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    lVar33 = 0;
    iVar34 = 0;
    do {
      if ((this->mask).super_ChLinkMask.nconstr <= lVar33) {
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      pCVar22 = ppCVar21[lVar33];
      if ((pCVar22->super_ChConstraintTwo).super_ChConstraint.active == true) {
        if ((iVar34 < 0) ||
           (lVar35 = (long)iVar34,
           (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
           m_rows <= lVar35)) goto LAB_00589868;
        iVar34 = iVar34 + 1;
        (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data
        .array[lVar35] = factor * (pCVar22->super_ChConstraintTwo).super_ChConstraint.l_i;
      }
      lVar33 = lVar33 + 1;
    } while (lVar31 != lVar33);
  }
  pCVar23 = (this->super_ChLinkMarkers).marker1;
  local_220.m_lhs.m_rhs = (RhsNested)local_100;
  pCVar24 = (this->super_ChLinkMarkers).marker2;
  pCVar25 = (this->super_ChLinkMarkers).super_ChLink.Body2;
  local_220.m_lhs.m_lhs.m_rhs = (RhsNested)local_1e0;
  local_f0 = *(undefined1 (*) [16])((pCVar23->abs_frame).super_ChFrame<double>.coord.rot.m_data + 2)
  ;
  local_d0 = (pCVar23->abs_frame).super_ChFrame<double>.coord.rot.m_data[3];
  local_220.m_lhs.m_lhs.m_lhs.m_rhs.m_matrix =
       &(pCVar24->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
        super_Matrix<double,_3,_3,_1,_3,_3>;
  auVar70._0_8_ = local_f0._0_8_ ^ 0x8000000000000000;
  auVar70._8_8_ = local_f0._8_8_ ^ 0x8000000000000000;
  auVar36._0_8_ = -local_d0;
  auVar36._8_8_ = 0x8000000000000000;
  local_c8 = vunpcklpd_avx(auVar70,local_f0);
  local_a0 = vshufpd_avx(local_f0,local_f0,1);
  local_b8 = vmovlpd_avx(auVar36);
  local_100 = *(undefined1 (*) [16])(pCVar23->abs_frame).super_ChFrame<double>.coord.rot.m_data;
  local_220.m_rhs = (RhsNested)local_180;
  auVar55._0_8_ = local_100._0_8_ ^ 0x8000000000000000;
  uStack_a8 = local_100._8_8_;
  auVar55._8_8_ = uStack_a8 ^ 0x8000000000000000;
  local_e0 = vshufpd_avx(local_100,auVar55,1);
  local_90 = vshufps_avx(auVar55,auVar55,0x4e);
  local_180._0_8_ = (pCVar24->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0]
  ;
  auVar36 = *(undefined1 (*) [16])
             ((pCVar24->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data + 1);
  local_148 = (pCVar24->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  local_180._8_8_ = auVar36._0_8_ ^ 0x8000000000000000;
  local_180._16_8_ = auVar36._8_8_ ^ 0x8000000000000000;
  local_138 = (pCVar24->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar72._0_8_ = -local_138;
  auVar72._8_8_ = 0x8000000000000000;
  local_168 = vunpcklpd_avx(auVar72,auVar36);
  local_150 = vmovlpd_avx(auVar72);
  auVar36 = vshufps_avx(local_180._8_16_,local_180._8_16_,0x4e);
  local_128 = vmovlpd_avx(local_180._8_16_);
  local_118 = vmovlpd_avx(auVar36);
  local_110 = (pCVar24->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_108 = (pCVar24->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar3 = (pCVar25->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  dVar4 = (pCVar25->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar37._0_8_ = dVar3 + dVar3;
  auVar37._8_8_ = dVar4 + dVar4;
  local_1e0._32_8_ = -auVar37._0_8_;
  local_1e0._40_8_ = -auVar37._8_8_;
  local_1e0._24_8_ = vmovlpd_avx(local_1e0._32_16_);
  dVar3 = (pCVar25->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar4 = (pCVar25->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_220.m_lhs.m_lhs.m_lhs.m_lhs.m_functor.m_other = 0.25;
  local_1b0._0_8_ = dVar3 + dVar3;
  local_1b0._8_8_ = dVar4 + dVar4;
  auVar36 = vshufpd_avx(local_1b0,local_1b0,1);
  local_1a0 = vshufpd_avx(local_1e0._32_16_,auVar37,1);
  auVar67._0_8_ = auVar36._0_8_ ^ 0x8000000000000000;
  auVar67._8_8_ = auVar36._8_8_ ^ 0x8000000000000000;
  local_1e0._0_8_ = vmovlpd_avx(auVar67);
  local_190 = vunpcklpd_avx(auVar67,local_1b0);
  local_288 = factor;
  local_1e0._8_8_ = local_1b0._0_8_;
  local_1e0._16_8_ = auVar37._8_8_;
  local_158 = (double)local_180._0_8_;
  dStack_140 = local_148;
  local_130 = (double)local_180._0_8_;
  local_120 = local_138;
  local_b0 = auVar55._0_8_;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,3,4,1,3,4>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>const>const>,Eigen::Matrix<double,3,4,1,3,4>,0>,Eigen::Matrix<double,4,4,1,4,4>,0>,Eigen::Matrix<double,4,4,1,4,4>,1>,Eigen::internal::assign_op<double,double>>
            (&local_280,&local_220,&local_289);
  ppCVar21 = (this->mask).super_ChLinkMask.constraints.
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar32 = 0;
  if (((*ppCVar21)->super_ChConstraintTwo).super_ChConstraint.active != false) {
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        < 1) goto LAB_00589868;
    dVar3 = (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
            m_data.array[0];
    uVar32 = 1;
    auVar68._0_8_ = -dVar3;
    auVar68._8_8_ = 0x8000000000000000;
    dVar4 = (double)vmovlpd_avx(auVar68);
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[0] = dVar4;
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] =
         dVar3 * -(this->super_ChLinkMarkers).relM.pos.m_data[2];
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] =
         dVar3 * (this->super_ChLinkMarkers).relM.pos.m_data[1];
  }
  if ((ppCVar21[1]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        <= (long)(ulong)uVar32) goto LAB_00589868;
    dVar3 = (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
            m_data.array[uVar32];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar3;
    uVar32 = uVar32 + 1;
    auVar27._8_8_ = 0x8000000000000000;
    auVar27._0_8_ = 0x8000000000000000;
    auVar36 = vxorpd_avx512vl(auVar38,auVar27);
    dVar4 = (double)vmovlpd_avx(auVar36);
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = dVar4;
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[0] =
         dVar3 * (this->super_ChLinkMarkers).relM.pos.m_data[2];
    auVar56._8_8_ = 0;
    auVar56._0_8_ = (this->super_ChLinkMarkers).relM.pos.m_data[0];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar36 = vfnmadd213sd_fma(auVar56,auVar38,auVar5);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar36._0_8_;
  }
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_288;
  if ((ppCVar21[2]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        <= (long)(ulong)uVar32) goto LAB_00589868;
    dVar3 = (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
            m_data.array[uVar32];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar3;
    uVar32 = uVar32 + 1;
    auVar69._0_8_ = -dVar3;
    auVar69._8_8_ = 0x8000000000000000;
    dVar3 = (double)vmovlpd_avx(auVar69);
    (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = dVar3;
    auVar57._0_8_ = -(this->super_ChLinkMarkers).relM.pos.m_data[1];
    auVar57._8_8_ = 0x8000000000000000;
    auVar37 = vunpcklpd_avx(auVar57,auVar39);
    auVar36 = vmovhpd_avx(auVar39,(this->super_ChLinkMarkers).relM.pos.m_data[0]);
    auVar36 = vfmadd213pd_fma(auVar36,auVar37,
                              *(undefined1 (*) [16])
                               (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data);
    *(undefined1 (*) [16])(this->super_ChLinkMarkers).super_ChLink.react_torque.m_data = auVar36;
  }
  if ((ppCVar21[4]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        <= (long)(ulong)uVar32) goto LAB_00589868;
    auVar28._8_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[2];
    auVar28._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[1];
    dVar3 = (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
            m_data.array[uVar32];
    auVar58._8_8_ = dVar3;
    auVar58._0_8_ = dVar3;
    uVar32 = uVar32 + 1;
    auVar36 = vmovhpd_avx(auVar28,local_280.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.
                                  m_storage.m_data.array[5]);
    auVar36 = vfmadd213pd_fma(auVar36,auVar58,
                              *(undefined1 (*) [16])
                               (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data);
    *(undefined1 (*) [16])(this->super_ChLinkMarkers).super_ChLink.react_torque.m_data = auVar36;
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[9];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar36 = vfmadd213sd_fma(auVar40,auVar58,auVar6);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar36._0_8_;
  }
  if ((ppCVar21[5]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        <= (long)(ulong)uVar32) goto LAB_00589868;
    auVar29._8_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[3];
    auVar29._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[2];
    dVar3 = (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
            m_data.array[uVar32];
    auVar59._8_8_ = dVar3;
    auVar59._0_8_ = dVar3;
    uVar32 = uVar32 + 1;
    auVar36 = vmovhpd_avx(auVar29,local_280.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.
                                  m_storage.m_data.array[6]);
    auVar36 = vfmadd213pd_fma(auVar36,auVar59,
                              *(undefined1 (*) [16])
                               (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data);
    *(undefined1 (*) [16])(this->super_ChLinkMarkers).super_ChLink.react_torque.m_data = auVar36;
    auVar41._8_8_ = 0;
    auVar41._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[10];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar36 = vfmadd213sd_fma(auVar41,auVar59,auVar7);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar36._0_8_;
  }
  if ((ppCVar21[6]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    if ((this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
        <= (long)(ulong)uVar32) {
LAB_00589868:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 7, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 7, 1>, Level = 1]"
                   );
    }
    auVar30._8_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[4];
    auVar30._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[3];
    dVar3 = (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
            m_data.array[uVar32];
    auVar60._8_8_ = dVar3;
    auVar60._0_8_ = dVar3;
    auVar36 = vmovhpd_avx(auVar30,local_280.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.
                                  m_storage.m_data.array[7]);
    auVar36 = vfmadd213pd_fma(auVar36,auVar60,
                              *(undefined1 (*) [16])
                               (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data);
    *(undefined1 (*) [16])(this->super_ChLinkMarkers).super_ChLink.react_torque.m_data = auVar36;
    auVar42._8_8_ = 0;
    auVar42._0_8_ =
         local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.
         array[0xb];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
    auVar36 = vfmadd213sd_fma(auVar42,auVar60,auVar8);
    (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar36._0_8_;
  }
  pCVar26 = (this->limit_X)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar26 != (ChLinkLimit *)0x0) && (pCVar26->m_active == true)) {
    if (*(bool *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar43._8_8_ = 0;
      auVar43._0_8_ = *(double *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x10);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = pCVar1->m_data[0];
      auVar36 = vfnmadd213sd_fma(auVar43,auVar71,auVar9);
      pCVar1->m_data[0] = auVar36._0_8_;
    }
    if (*(bool *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(double *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x10);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = pCVar1->m_data[0];
      auVar36 = vfmadd213sd_fma(auVar44,auVar71,auVar10);
      pCVar1->m_data[0] = auVar36._0_8_;
    }
  }
  pCVar26 = (this->limit_Y)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar26 != (ChLinkLimit *)0x0) && (pCVar26->m_active == true)) {
    if (*(bool *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(double *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1];
      auVar36 = vfnmadd213sd_fma(auVar45,auVar71,auVar11);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = auVar36._0_8_;
    }
    if (*(bool *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *(double *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x10);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1];
      auVar36 = vfmadd213sd_fma(auVar46,auVar71,auVar12);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[1] = auVar36._0_8_;
    }
  }
  pCVar26 = (this->limit_Z)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar26 != (ChLinkLimit *)0x0) && (pCVar26->m_active == true)) {
    if (*(bool *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar47._8_8_ = 0;
      auVar47._0_8_ = *(double *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x10);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2];
      auVar36 = vfnmadd213sd_fma(auVar47,auVar71,auVar13);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = auVar36._0_8_;
    }
    if (*(bool *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(double *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x10);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2];
      auVar36 = vfmadd213sd_fma(auVar48,auVar71,auVar14);
      (this->super_ChLinkMarkers).super_ChLink.react_force.m_data[2] = auVar36._0_8_;
    }
  }
  pCVar26 = (this->limit_Rx)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar26 != (ChLinkLimit *)0x0) && (pCVar26->m_active == true)) {
    if (*(bool *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar49._8_8_ = 0;
      auVar49._0_8_ = *(double *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x10);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = pCVar2->m_data[0];
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_288 * -0.5;
      auVar36 = vfmadd213sd_fma(auVar61,auVar49,auVar15);
      pCVar2->m_data[0] = auVar36._0_8_;
    }
    if (*(bool *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar62._8_8_ = 0;
      auVar62._0_8_ = *(double *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x10);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = pCVar2->m_data[0];
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_288 * 0.5;
      auVar36 = vfmadd213sd_fma(auVar62,auVar50,auVar16);
      pCVar2->m_data[0] = auVar36._0_8_;
    }
  }
  pCVar26 = (this->limit_Ry)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar26 != (ChLinkLimit *)0x0) && (pCVar26->m_active == true)) {
    if (*(bool *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(double *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x10);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_288 * -0.5;
      auVar36 = vfmadd213sd_fma(auVar63,auVar51,auVar17);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar36._0_8_;
    }
    if (*(bool *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar64._8_8_ = 0;
      auVar64._0_8_ = *(double *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x10);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1];
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_288 * 0.5;
      auVar36 = vfmadd213sd_fma(auVar64,auVar52,auVar18);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[1] = auVar36._0_8_;
    }
  }
  pCVar26 = (this->limit_Rz)._M_t.
            super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
            _M_t.
            super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
            .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar26 != (ChLinkLimit *)0x0) && (pCVar26->m_active == true)) {
    if (*(bool *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(double *)((long)&(pCVar26->constr_lower).super_ChConstraintTwo + 0x10);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_288 * -0.5;
      auVar36 = vfmadd213sd_fma(auVar65,auVar53,auVar19);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar36._0_8_;
    }
    if (*(bool *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      auVar66._8_8_ = 0;
      auVar66._0_8_ = *(double *)((long)&(pCVar26->constr_upper).super_ChConstraintTwo + 0x10);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2];
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_288 * 0.5;
      auVar36 = vfmadd213sd_fma(auVar66,auVar54,auVar20);
      (this->super_ChLinkMarkers).super_ChLink.react_torque.m_data[2] = auVar36._0_8_;
    }
  }
  return;
}

Assistant:

void ChLinkLock::ConstraintsFetch_react(double factor) {
    react_force = VNULL;
    react_torque = VNULL;

    // From constraints to react vector:
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            react(cnt) = mask.Constr_N(i).Get_l_i() * factor;
            cnt++;
        }
    }

    // From react vector to the 'intuitive' react_force and react_torque
    const ChQuaternion<>& q2 = Body2->GetRot();
    const ChQuaternion<>& q1p = marker1->GetAbsCoord().rot;
    const ChQuaternion<>& qs = marker2->GetCoord().rot;
    const ChMatrix33<>& Cs = marker2->GetA();

    ChMatrix44<> Chi__q1p_barT;  //[Chi] * [transpose(bar(q1p))]
    Chi__q1p_barT(0, 0) = q1p.e0();
    Chi__q1p_barT(0, 1) = q1p.e1();
    Chi__q1p_barT(0, 2) = q1p.e2();
    Chi__q1p_barT(0, 3) = q1p.e3();
    Chi__q1p_barT(1, 0) = q1p.e1();
    Chi__q1p_barT(1, 1) = -q1p.e0();
    Chi__q1p_barT(1, 2) = q1p.e3();
    Chi__q1p_barT(1, 3) = -q1p.e2();
    Chi__q1p_barT(2, 0) = q1p.e2();
    Chi__q1p_barT(2, 1) = -q1p.e3();
    Chi__q1p_barT(2, 2) = -q1p.e0();
    Chi__q1p_barT(2, 3) = q1p.e1();
    Chi__q1p_barT(3, 0) = q1p.e3();
    Chi__q1p_barT(3, 1) = q1p.e2();
    Chi__q1p_barT(3, 2) = -q1p.e1();
    Chi__q1p_barT(3, 3) = -q1p.e0();

    ChMatrix44<> qs_tilde;
    qs_tilde(0, 0) = qs.e0();
    qs_tilde(0, 1) = -qs.e1();
    qs_tilde(0, 2) = -qs.e2();
    qs_tilde(0, 3) = -qs.e3();
    qs_tilde(1, 0) = qs.e1();
    qs_tilde(1, 1) = qs.e0();
    qs_tilde(1, 2) = -qs.e3();
    qs_tilde(1, 3) = qs.e2();
    qs_tilde(2, 0) = qs.e2();
    qs_tilde(2, 1) = qs.e3();
    qs_tilde(2, 2) = qs.e0();
    qs_tilde(2, 3) = -qs.e1();
    qs_tilde(3, 0) = qs.e3();
    qs_tilde(3, 1) = -qs.e2();
    qs_tilde(3, 2) = qs.e1();
    qs_tilde(3, 3) = qs.e0();

    // Ts = 0.5*CsT*G(q2)*Chi*(q1 qp)_barT*qs~*KT*lambda
    ChGlMatrix34<> Gl_q2(q2);
    ChMatrix34<> Ts = 0.25 * Cs.transpose() * Gl_q2 * Chi__q1p_barT * qs_tilde;

    // Translational constraint reaction force = -lambda_translational
    // Translational constraint reaction torque = -d~''(t)*lambda_translational
    // No reaction force from the rotational constraints

    int n_constraint = 0;

    if (mask.Constr_X().IsActive()) {
        react_force.x() = -react(n_constraint);
        react_torque.y() = -relM.pos.z() * react(n_constraint);
        react_torque.z() = relM.pos.y() * react(n_constraint);
        n_constraint++;
    }
    if (mask.Constr_Y().IsActive()) {
        react_force.y() = -react(n_constraint);
        react_torque.x() = relM.pos.z() * react(n_constraint);
        react_torque.z() += -relM.pos.x() * react(n_constraint);
        n_constraint++;
    }
    if (mask.Constr_Z().IsActive()) {
        react_force.z() = -react(n_constraint);
        react_torque.x() += -relM.pos.y() * react(n_constraint);
        react_torque.y() += relM.pos.x() * react(n_constraint);
        n_constraint++;
    }

    if (mask.Constr_E1().IsActive()) {
        react_torque.x() += Ts(0, 1) * (react(n_constraint));
        react_torque.y() += Ts(1, 1) * (react(n_constraint));
        react_torque.z() += Ts(2, 1) * (react(n_constraint));
        n_constraint++;
    }
    if (mask.Constr_E2().IsActive()) {
        react_torque.x() += Ts(0, 2) * (react(n_constraint));
        react_torque.y() += Ts(1, 2) * (react(n_constraint));
        react_torque.z() += Ts(2, 2) * (react(n_constraint));
        n_constraint++;
    }
    if (mask.Constr_E3().IsActive()) {
        react_torque.x() += Ts(0, 3) * (react(n_constraint));
        react_torque.y() += Ts(1, 3) * (react(n_constraint));
        react_torque.z() += Ts(2, 3) * (react(n_constraint));
        n_constraint++;
    }

    // ***TO DO***?: TRANSFORMATION FROM delta COORDS TO LINK COORDS, if
    // non-default delta
    // if delta rotation?

    // add also the contribution from link limits to the react_force and
    // react_torque.
    if (limit_X && limit_X->IsActive()) {
        if (limit_X->constr_lower.IsActive()) {
            react_force.x() -= factor * limit_X->constr_lower.Get_l_i();
        }
        if (limit_X->constr_upper.IsActive()) {
            react_force.x() += factor * limit_X->constr_upper.Get_l_i();
        }
    }
    if (limit_Y && limit_Y->IsActive()) {
        if (limit_Y->constr_lower.IsActive()) {
            react_force.y() -= factor * limit_Y->constr_lower.Get_l_i();
        }
        if (limit_Y->constr_upper.IsActive()) {
            react_force.y() += factor * limit_Y->constr_upper.Get_l_i();
        }
    }
    if (limit_Z && limit_Z->IsActive()) {
        if (limit_Z->constr_lower.IsActive()) {
            react_force.z() -= factor * limit_Z->constr_lower.Get_l_i();
        }
        if (limit_Z->constr_upper.IsActive()) {
            react_force.z() += factor * limit_Z->constr_upper.Get_l_i();
        }
    }
    if (limit_Rx && limit_Rx->IsActive()) {
        if (limit_Rx->constr_lower.IsActive()) {
            react_torque.x() -= 0.5 * factor * limit_Rx->constr_lower.Get_l_i();
        }
        if (limit_Rx->constr_upper.IsActive()) {
            react_torque.x() += 0.5 * factor * limit_Rx->constr_upper.Get_l_i();
        }
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        if (limit_Ry->constr_lower.IsActive()) {
            react_torque.y() -= 0.5 * factor * limit_Ry->constr_lower.Get_l_i();
        }
        if (limit_Ry->constr_upper.IsActive()) {
            react_torque.y() += 0.5 * factor * limit_Ry->constr_upper.Get_l_i();
        }
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        if (limit_Rz->constr_lower.IsActive()) {
            react_torque.z() -= 0.5 * factor * limit_Rz->constr_lower.Get_l_i();
        }
        if (limit_Rz->constr_upper.IsActive()) {
            react_torque.z() += 0.5 * factor * limit_Rz->constr_upper.Get_l_i();
        }
    }

    // the internal forces add their contribute to the reactions
    // NOT NEEDED?, since C_force and react_force must stay separated???
    // react_force  = Vadd(react_force, C_force);
    // react_torque = Vadd(react_torque, C_torque);
}